

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageCrop(Image *image,Rectangle crop)

{
  int iVar1;
  void *pvVar2;
  char *text;
  void *__dest;
  int iVar3;
  size_t __n;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar6 = crop.width;
  fVar5 = crop.height;
  fVar4 = crop.x;
  fVar9 = crop.y;
  if (((image->data == (void *)0x0) || (image->width == 0)) || (image->height == 0)) {
    return;
  }
  if (fVar4 < 0.0) {
    fVar6 = fVar4 + fVar6;
    fVar4 = 0.0;
  }
  if (fVar9 < 0.0) {
    fVar5 = fVar9 + fVar5;
    fVar9 = 0.0;
  }
  fVar7 = (float)image->width;
  if (fVar7 < fVar4 + fVar6) {
    fVar6 = fVar7 - fVar4;
  }
  fVar8 = (float)image->height;
  if (fVar8 < fVar5 + fVar9) {
    fVar5 = fVar8 - fVar9;
  }
  if ((fVar7 < fVar4) || (fVar8 < fVar9)) {
    text = "IMAGE: Failed to crop, rectangle out of bounds";
  }
  else {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      iVar1 = GetPixelDataSize(1,1,image->format);
      pvVar2 = malloc((long)((int)(fVar6 * fVar5) * iVar1));
      __n = (size_t)(iVar1 * (int)fVar6);
      __dest = pvVar2;
      for (iVar3 = (int)fVar9; iVar3 < (int)(fVar5 + fVar9); iVar3 = iVar3 + 1) {
        memcpy(__dest,(void *)((long)((image->width * iVar3 + (int)fVar4) * iVar1) +
                              (long)image->data),__n);
        __dest = (void *)((long)__dest + __n);
      }
      free(image->data);
      image->data = pvVar2;
      image->width = (int)fVar6;
      image->height = (int)fVar5;
      return;
    }
    text = "Image manipulation not supported for compressed formats";
  }
  TraceLog(4,text);
  return;
}

Assistant:

void ImageCrop(Image *image, Rectangle crop)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    // Security checks to validate crop rectangle
    if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
    if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
    if ((crop.x + crop.width) > image->width) crop.width = image->width - crop.x;
    if ((crop.y + crop.height) > image->height) crop.height = image->height - crop.y;
    if ((crop.x > image->width) || (crop.y > image->height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Failed to crop, rectangle out of bounds");
        return;
    }

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);

        unsigned char *croppedData = (unsigned char *)RL_MALLOC((int)(crop.width*crop.height)*bytesPerPixel);

        // OPTION 1: Move cropped data line-by-line
        for (int y = (int)crop.y, offsetSize = 0; y < (int)(crop.y + crop.height); y++)
        {
            memcpy(croppedData + offsetSize, ((unsigned char *)image->data) + (y*image->width + (int)crop.x)*bytesPerPixel, (int)crop.width*bytesPerPixel);
            offsetSize += ((int)crop.width*bytesPerPixel);
        }

        /*
        // OPTION 2: Move cropped data pixel-by-pixel or byte-by-byte
        for (int y = (int)crop.y; y < (int)(crop.y + crop.height); y++)
        {
            for (int x = (int)crop.x; x < (int)(crop.x + crop.width); x++)
            {
                //memcpy(croppedData + ((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + x)*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) croppedData[((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + x)*bytesPerPixel + i];
            }
        }
        */

        RL_FREE(image->data);
        image->data = croppedData;
        image->width = (int)crop.width;
        image->height = (int)crop.height;
    }
}